

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XMLReader::skipIfQuote(XMLReader *this,XMLCh *chGotten)

{
  bool bVar1;
  XMLCh *chGotten_local;
  XMLReader *this_local;
  
  if ((this->fCharIndex == this->fCharsAvail) && (bVar1 = refreshCharBuffer(this), !bVar1)) {
    return false;
  }
  *chGotten = this->fCharBuf[this->fCharIndex];
  if ((*chGotten == L'\"') || (*chGotten == L'\'')) {
    this->fCharIndex = this->fCharIndex + 1;
    this->fCurCol = this->fCurCol + 1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XMLReader::skipIfQuote(XMLCh& chGotten)
{
    if (fCharIndex == fCharsAvail && !refreshCharBuffer())
        return false;

    chGotten = fCharBuf[fCharIndex];
    if ((chGotten == chDoubleQuote) || (chGotten == chSingleQuote))
    {
        fCharIndex++;
        fCurCol++;
        return true;
    }
    return false;
}